

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O3

void __thiscall CScheduler::serviceQueue(CScheduler *this)

{
  byte bVar1;
  cv_status cVar2;
  undefined8 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  Function f;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  time_point timeToWaitFor;
  _Any_data _Stack_c8;
  code *local_b8;
  code *local_b0;
  unique_lock<std::mutex> local_a8;
  reverse_lock local_98;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._M_device = &(this->newTaskMutex).super_mutex;
  local_a8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_a8);
  iVar4 = this->nThreadsServicingQueue;
  this->nThreadsServicingQueue = iVar4 + 1;
  if (this->stopRequested == false) {
    if ((this->stopWhenEmpty != true) ||
       ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      bVar1 = 0;
      do {
        if ((bVar1 & 1) == 0) {
          do {
            if ((this->stopWhenEmpty != false) ||
               ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) break;
            std::condition_variable::wait((unique_lock *)&this->newTaskScheduled);
          } while (this->stopRequested != true);
        }
        do {
          bVar1 = this->stopRequested;
          if (((bool)bVar1 != false) ||
             ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
          goto LAB_0038b292;
          local_98.lock =
               *(UniqueLock<AnnotatedMixin<std::mutex>_> **)
                ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
          cVar2 = std::condition_variable::
                  __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            (&this->newTaskScheduled,&local_a8,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&local_98);
        } while (cVar2 != timeout);
        bVar1 = this->stopRequested;
LAB_0038b292:
        if ((bVar1 & 1) != 0) break;
        if ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::wallet::_GLOBAL__N_1::std::function<void_()>::function
                    ((function<void_()> *)&_Stack_c8,
                     (function<void_()> *)
                     &(this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1].
                      _M_parent);
          std::
          _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>>
          ::erase_abi_cxx11_((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,std::function<void()>>>>
                              *)&this->taskQueue,
                             (this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
          ;
          UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
                    (&local_98,(UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_a8,"lock",
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp"
                     ,0x3b);
          if (local_b8 == (code *)0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar3 = std::__throw_bad_function_call();
              std::unique_lock<std::mutex>::~unique_lock(&local_a8);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar3);
              }
            }
            goto LAB_0038b45d;
          }
          (*local_b0)(&_Stack_c8);
          UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&local_98);
          if (local_b8 != (code *)0x0) {
            (*local_b8)(&_Stack_c8,&_Stack_c8,__destroy_functor);
          }
          bVar1 = this->stopRequested;
          if ((bVar1 & 1) != 0) break;
        }
      } while ((this->stopWhenEmpty != true) ||
              ((this->taskQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0));
    }
    iVar4 = this->nThreadsServicingQueue + -1;
  }
  this->nThreadsServicingQueue = iVar4;
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0038b45d:
  __stack_chk_fail();
}

Assistant:

void CScheduler::serviceQueue()
{
    WAIT_LOCK(newTaskMutex, lock);
    ++nThreadsServicingQueue;

    // newTaskMutex is locked throughout this loop EXCEPT
    // when the thread is waiting or when the user's function
    // is called.
    while (!shouldStop()) {
        try {
            while (!shouldStop() && taskQueue.empty()) {
                // Wait until there is something to do.
                newTaskScheduled.wait(lock);
            }

            // Wait until either there is a new task, or until
            // the time of the first item on the queue:

            while (!shouldStop() && !taskQueue.empty()) {
                std::chrono::steady_clock::time_point timeToWaitFor = taskQueue.begin()->first;
                if (newTaskScheduled.wait_until(lock, timeToWaitFor) == std::cv_status::timeout) {
                    break; // Exit loop after timeout, it means we reached the time of the event
                }
            }

            // If there are multiple threads, the queue can empty while we're waiting (another
            // thread may service the task we were waiting on).
            if (shouldStop() || taskQueue.empty())
                continue;

            Function f = taskQueue.begin()->second;
            taskQueue.erase(taskQueue.begin());

            {
                // Unlock before calling f, so it can reschedule itself or another task
                // without deadlocking:
                REVERSE_LOCK(lock);
                f();
            }
        } catch (...) {
            --nThreadsServicingQueue;
            throw;
        }
    }
    --nThreadsServicingQueue;
    newTaskScheduled.notify_one();
}